

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O0

Matrix_Dense<double,_0UL,_0UL> *
Disa::operator*(Matrix_Dense<double,_0UL,_0UL> *__return_storage_ptr__,Scalar *scalar,
               Matrix_Dense<double,_0UL,_0UL> *matrix)

{
  matrix_type *pmVar1;
  Matrix_Dense<double,_0UL,_0UL> *matrix_local;
  Scalar *scalar_local;
  
  pmVar1 = Matrix_Dense<double,_0UL,_0UL>::operator*=(matrix,scalar);
  Matrix_Dense<double,_0UL,_0UL>::Matrix_Dense(__return_storage_ptr__,pmVar1);
  return __return_storage_ptr__;
}

Assistant:

constexpr Matrix_Dense<_type, _row, _col> operator*(const Scalar& scalar, Matrix_Dense<_type, _row, _col> matrix) {
  return matrix *= scalar;
}